

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O2

void Am_Move_Grow_Command_Selective_Undo_proc(Am_Object *command_obj)

{
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,command_obj);
  Am_Object::Am_Object(&AStack_28,&Am_No_Object);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  move_grow_general_undo_redo(&local_20,true,true,false,&AStack_28,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Move_Grow_Command_Selective_Undo,
                 (Am_Object command_obj))
{
  //assume object has moved, so no longer where the command object put it, so
  //put it there again, and save current place in case undone.
  move_grow_general_undo_redo(command_obj, true, true, false);
}